

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O2

void __thiscall libtorrent::aux::socks5::read_domainname(socks5 *this,error_code *e)

{
  byte bVar1;
  bool bVar2;
  address local_68;
  undefined8 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  mutable_buffer local_30;
  
  if (this->m_abort == false) {
    if (e->failed_ == true) {
      if (((this->m_alerts->m_alert_mask)._M_i.m_val & 1) != 0) {
        local_68.type_._0_1_ = 0x28;
        alert_manager::
        emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code_const&>
                  (this->m_alerts,&this->m_proxy_addr,(operation_t *)&local_68,e);
      }
      this->m_failures = this->m_failures + 1;
      retry_connection(this);
    }
    else {
      bVar1 = (this->m_tmp_buf)._M_elems[0];
      bVar2 = (this->m_proxy_addr).impl_.data_.base.sa_family != 2;
      if (bVar2) {
        local_68.ipv6_address_.addr_.__in6_u._0_8_ =
             *(undefined8 *)((long)&(this->m_proxy_addr).impl_.data_ + 8);
        local_68.ipv6_address_.addr_.__in6_u._8_8_ =
             *(undefined8 *)((long)&(this->m_proxy_addr).impl_.data_ + 0x10);
        local_68.ipv6_address_.scope_id_ =
             (unsigned_long)(this->m_proxy_addr).impl_.data_.v6.sin6_scope_id;
        local_68.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      }
      else {
        local_68.ipv4_address_.addr_.s_addr =
             (in4_addr_type)(this->m_proxy_addr).impl_.data_.v6.sin6_flowinfo;
        local_68.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        local_68.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_68.ipv6_address_.scope_id_ = 0;
      }
      local_68.type_ = (uint)bVar2;
      boost::asio::ip::detail::endpoint::address(&(this->m_udp_proxy_addr).impl_,&local_68);
      (this->m_udp_proxy_addr).impl_.data_.v4.sin_port =
           *(in_port_t *)((this->m_tmp_buf)._M_elems + (ulong)bVar1 + 1);
      this->m_active = true;
      this->m_failures = 0;
      local_30.size_ = 10;
      local_30.data_ = &this->m_tmp_buf;
      ::std::__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::socks5,void>
                ((__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2> *)&local_48,
                 (__weak_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_68._0_8_ = hung_up;
      local_68.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_68.ipv6_address_.addr_.__in6_u._8_8_ = local_48;
      local_68.ipv6_address_.scope_id_ = (unsigned_long)a_Stack_40[0]._M_pi;
      local_48 = 0;
      a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::asio::
      async_read<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::asio::mutable_buffer,std::_Bind<void(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                (&this->m_socks5_sock,&local_30,
                 (_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                  *)&local_68,(type *)0x0);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68.ipv6_address_.scope_id_);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
    }
  }
  return;
}

Assistant:

void socks5::read_domainname(error_code const& e)
{
	COMPLETE_ASYNC("socks5::read_domainname");

	if (m_abort) return;
	if (e)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::handshake, e);
		++m_failures;
		retry_connection();
		return;
	}

	using namespace libtorrent::aux;

	char* p = m_tmp_buf.data();
	int const len = read_uint8(p);
	p += len;
	m_udp_proxy_addr.address(m_proxy_addr.address());
	m_udp_proxy_addr.port(read_uint16(p));

	// we're done!
	m_active = true;
	m_failures = 0;

	ADD_OUTSTANDING_ASYNC("socks5::hung_up");
	boost::asio::async_read(m_socks5_sock, boost::asio::buffer(m_tmp_buf.data(), 10)
		, std::bind(&socks5::hung_up, self(), _1));
}